

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  anon_struct_4_9_b482b7ef_for_fg *data;
  char cVar1;
  void *p;
  bool bVar2;
  u8 uVar3;
  ushort uVar4;
  uint uVar5;
  u32 uVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar7;
  Column *pCVar8;
  char *pcVar9;
  long *plVar10;
  byte *pKey;
  HashElem *pHVar11;
  size_t sVar12;
  ulong uVar13;
  undefined1 *puVar14;
  byte *pbVar15;
  byte bVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  Column *p_00;
  char *pcVar20;
  long lVar21;
  u32 cnt;
  Hash ht;
  uint local_84;
  char *local_80;
  ExprList *local_78;
  uint local_6c;
  Column *local_68;
  Column **local_60;
  i16 *local_58;
  ulong local_50;
  Hash local_48;
  
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    pCVar8 = (Column *)0x0;
LAB_0019242c:
    p_00 = pCVar8;
    pcVar20 = (char *)((long)&pParse->pIdxExpr + 7);
    uVar18 = 0;
  }
  else {
    uVar18 = pEList->nExpr;
    local_78 = pEList;
    pCVar8 = (Column *)sqlite3DbMallocZero((sqlite3 *)pParse,(long)(int)uVar18 << 4);
    uVar5 = 0x7fff;
    if ((int)uVar18 < 0x7fff) {
      uVar5 = uVar18;
    }
    *pnCol = (i16)uVar5;
    *paCol = pCVar8;
    if ((long)(int)uVar18 < 1) goto LAB_0019242c;
    local_78 = (ExprList *)local_78->a;
    local_50 = (ulong)uVar5;
    uVar19 = 0;
    local_80 = (char *)((long)&pParse->pIdxExpr + 7);
    local_6c = uVar5;
    local_68 = pCVar8;
    local_60 = paCol;
    local_58 = pnCol;
    do {
      p_00 = local_68;
      pnCol = local_58;
      paCol = local_60;
      pcVar20 = local_80;
      uVar18 = (uint)uVar19;
      if (*local_80 != '\0') break;
      data = &local_78->a[uVar19 - 1].fg;
      pcVar20 = *(char **)(data + 2);
      if ((pcVar20 == (char *)0x0) || ((*(byte *)((long)(data + 4) + 1) & 3) != 0)) {
        for (pcVar9 = *(char **)data; (*(uint *)(pcVar9 + 4) & 0x82000) != 0;
            pcVar9 = *(char **)pcVar9) {
          if ((*(uint *)(pcVar9 + 4) >> 0x13 & 1) == 0) {
            pcVar9 = pcVar9 + 0x10;
          }
          else {
            pcVar9 = (char *)(*(long *)(pcVar9 + 0x20) + 8);
          }
        }
        for (; cVar1 = *pcVar9, cVar1 == -0x73; pcVar9 = *(char **)(pcVar9 + 0x18)) {
        }
        if (cVar1 == ';') {
          plVar10 = (long *)(pcVar9 + 8);
LAB_0019229d:
          pcVar20 = (char *)*plVar10;
        }
        else if (((cVar1 == -0x59) && ((pcVar9[7] & 3U) == 0)) &&
                (lVar21 = *(long *)(pcVar9 + 0x40), lVar21 != 0)) {
          uVar4 = *(ushort *)(pcVar9 + 0x30);
          if ((short)uVar4 < 0) {
            uVar4 = *(ushort *)(lVar21 + 0x34);
            pcVar20 = "rowid";
            if ((short)uVar4 < 0) goto LAB_001922a5;
          }
          plVar10 = (long *)((ulong)uVar4 * 0x10 + *(long *)(lVar21 + 8));
          goto LAB_0019229d;
        }
        if (pcVar20 != (char *)0x0) goto LAB_001922a5;
LAB_001922b1:
        pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"column%d",(ulong)((uint)uVar19 + 1));
      }
      else {
LAB_001922a5:
        uVar6 = sqlite3IsTrueOrFalse(pcVar20);
        if (uVar6 != 0) goto LAB_001922b1;
        pKey = (byte *)sqlite3DbStrDup((sqlite3 *)pParse,pcVar20);
      }
      local_84 = 0;
LAB_001922dd:
      if (pKey == (byte *)0x0) {
        pCVar8->zCnName = (char *)0x0;
        bVar2 = true;
        pKey = (byte *)0x0;
      }
      else {
        pHVar11 = findElementWithHash(&local_48,(char *)pKey,(uint *)0x0);
        if (pHVar11->data != (void *)0x0) goto code_r0x00192300;
        pCVar8->zCnName = (char *)pKey;
        bVar16 = *pKey;
        if (bVar16 != 0) {
          uVar3 = '\0';
          pbVar15 = pKey;
          do {
            pbVar15 = pbVar15 + 1;
            uVar3 = uVar3 + ""[bVar16];
            bVar16 = *pbVar15;
          } while (bVar16 != 0);
          bVar2 = false;
          goto LAB_0019239f;
        }
        bVar2 = false;
      }
      uVar3 = '\0';
LAB_0019239f:
      pCVar8->hName = uVar3;
      if ((*(byte *)((long)(data + 4) + 2) & 1) != 0) {
        pbVar15 = (byte *)((long)&pCVar8->colFlags + 1);
        *pbVar15 = *pbVar15 | 4;
      }
      if ((!bVar2) &&
         (puVar14 = (undefined1 *)sqlite3HashInsert(&local_48,(char *)pKey,data),
         (anon_struct_4_9_b482b7ef_for_fg *)puVar14 == data)) {
        sqlite3OomFault((sqlite3 *)pParse);
      }
      uVar19 = uVar19 + 1;
      pCVar8 = pCVar8 + 1;
      p_00 = local_68;
      pnCol = local_58;
      paCol = local_60;
      pcVar20 = local_80;
      uVar18 = local_6c;
    } while (uVar19 != local_50);
  }
  sqlite3HashClear(&local_48);
  if (*pcVar20 == '\0') {
    return extraout_EAX;
  }
  if (uVar18 == 0) {
    iVar7 = extraout_EAX;
    if (p_00 == (Column *)0x0) goto LAB_001924a5;
  }
  else {
    lVar21 = 0;
    do {
      p = *(void **)((long)&p_00->zCnName + lVar21);
      if (p != (void *)0x0) {
        sqlite3DbFreeNN((sqlite3 *)pParse,p);
      }
      lVar21 = lVar21 + 0x10;
    } while ((ulong)uVar18 << 4 != lVar21);
  }
  sqlite3DbFreeNN((sqlite3 *)pParse,p_00);
  iVar7 = extraout_EAX_00;
LAB_001924a5:
  *paCol = (Column *)0x0;
  *pnCol = 0;
  return iVar7;
code_r0x00192300:
  if ((*(byte *)((long)pHVar11->data + 0x11) & 0x80) != 0) {
    pbVar15 = (byte *)((long)&pCVar8->colFlags + 1);
    *pbVar15 = *pbVar15 | 4;
  }
  sVar12 = strlen((char *)pKey);
  if ((sVar12 & 0x3fffffff) == 0) {
    uVar17 = 0;
  }
  else {
    uVar13 = (ulong)((uint)sVar12 & 0x3fffffff);
    do {
      if (uVar13 < 2) {
        bVar16 = *pKey;
        uVar13 = 0;
        break;
      }
      uVar13 = uVar13 - 1;
      bVar16 = pKey[uVar13 & 0xffffffff];
    } while (0xfffffffffffffff5 < (ulong)bVar16 - 0x3a);
    uVar17 = (ulong)((uint)sVar12 & 0x3fffffff);
    if (bVar16 == 0x3a) {
      uVar17 = uVar13 & 0xffffffff;
    }
  }
  local_84 = local_84 + 1;
  pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%.*z:%u",uVar17);
  if (3 < local_84) {
    sqlite3_randomness(4,&local_84);
  }
  goto LAB_001922dd;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}